

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Clock.cxx
# Opt level: O0

void __thiscall Fl_Clock_Output::draw(Fl_Clock_Output *this)

{
  int X;
  int Y;
  int W;
  int H;
  Fl_Clock_Output *this_local;
  
  X = Fl_Widget::x(&this->super_Fl_Widget);
  Y = Fl_Widget::y(&this->super_Fl_Widget);
  W = Fl_Widget::w(&this->super_Fl_Widget);
  H = Fl_Widget::h(&this->super_Fl_Widget);
  draw(this,X,Y,W,H);
  Fl_Widget::draw_label(&this->super_Fl_Widget);
  return;
}

Assistant:

void Fl_Clock_Output::draw() {
  draw(x(), y(), w(), h());
  draw_label();
}